

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O1

void do_cmd_accept_character(command *cmd)

{
  uint32_t *puVar1;
  int16_t *piVar2;
  ushort uVar3;
  player_race *ppVar4;
  player_body *ppVar5;
  object *poVar6;
  object *poVar7;
  bool bVar8;
  player_body *ppVar9;
  undefined6 uVar10;
  player *ppVar11;
  player_body *ppVar12;
  uint8_t uVar13;
  _Bool _Var14;
  int iVar15;
  uint32_t uVar16;
  char *pcVar18;
  level_conflict *plVar19;
  equip_slot *peVar20;
  obj_property *poVar21;
  object_kind *poVar22;
  uint *puVar23;
  object *poVar24;
  object *poVar25;
  town *ptVar26;
  ego_item *peVar27;
  uint uVar28;
  int iVar29;
  wchar_t wVar30;
  start_item *psVar31;
  ulong uVar32;
  long lVar33;
  char local_88 [88];
  int iVar17;
  
  options_init_cheat();
  pcVar18 = option_name(0x2a);
  option_set(pcVar18,0);
  iVar15 = (uint)player->hitdie * 0x32 + -0x32;
  iVar17 = iVar15 * 3 + 7;
  if (-1 < iVar15 * 3) {
    iVar17 = iVar15 * 3;
  }
  iVar29 = iVar15 * 5 + 7;
  if (-1 < iVar15 * 5) {
    iVar29 = iVar15 * 5;
  }
  lVar33 = 1;
  do {
    do {
      uVar16 = Rand_div((uint)player->hitdie);
      ppVar11 = player;
      player->player_hp[lVar33] = (short)uVar16 + player->player_hp[lVar33 + -1] + 1;
      lVar33 = lVar33 + 1;
    } while (lVar33 != 0x32);
    lVar33 = 1;
  } while (((int)ppVar11->player_hp[0x31] < (iVar17 >> 3) + 0x32) ||
          ((iVar29 >> 3) + 0x32 < (int)ppVar11->player_hp[0x31]));
  ignore_birth_init();
  if ((player->opts).opt[0x2b] == true) {
    plVar19 = level_by_name(world,"Anfauglith 58");
    ppVar11 = player;
    player->place = (int16_t)plVar19->index;
    ppVar11->upkeep->create_stair = FEAT_MORE;
  }
  else {
    player->place = player->home;
  }
  history_clear(player);
  history_add(player,"Began the quest to destroy Morgoth.",L'\x01');
  message_add(" ",0);
  message_add("  ",0);
  message_add("====================",0);
  message_add("  ",0);
  message_add(" ",0);
  ppVar12 = bodies;
  ppVar11 = player;
  ppVar4 = player->race;
  if (ppVar4 == (player_race *)0x0) {
    __assert_fail("p->race",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-birth.c"
                  ,0x19e,"void player_embody(struct player *)");
  }
  ppVar5 = bodies[ppVar4->body].next;
  pcVar18 = bodies[ppVar4->body].name;
  ppVar9 = bodies + ppVar4->body;
  uVar10 = *(undefined6 *)&ppVar9->field_0x12;
  peVar20 = *(equip_slot **)(&ppVar9->count + 4);
  (ppVar11->body).count = ppVar9->count;
  *(undefined6 *)&(ppVar11->body).field_0x12 = uVar10;
  (ppVar11->body).slots = peVar20;
  (ppVar11->body).next = ppVar5;
  (ppVar11->body).name = pcVar18;
  my_strcpy(local_88,ppVar12[ppVar4->body].name,0x50);
  pcVar18 = string_make(local_88);
  (ppVar11->body).name = pcVar18;
  peVar20 = (equip_slot *)mem_zalloc((ulong)(ppVar11->body).count << 5);
  (ppVar11->body).slots = peVar20;
  if ((ppVar11->body).count != 0) {
    lVar33 = 0;
    uVar32 = 0;
    do {
      peVar20 = bodies[ppVar11->race->body].slots;
      *(undefined2 *)((long)&((ppVar11->body).slots)->type + lVar33) =
           *(undefined2 *)((long)&peVar20->type + lVar33);
      my_strcpy(local_88,*(char **)((long)&peVar20->name + lVar33),0x50);
      pcVar18 = string_make(local_88);
      *(char **)((long)&((ppVar11->body).slots)->name + lVar33) = pcVar18;
      uVar32 = uVar32 + 1;
      lVar33 = lVar33 + 0x20;
    } while (uVar32 < (ppVar11->body).count);
  }
  ppVar11 = player;
  uVar3 = z_info->start_gold;
  player->au_birth = (uint)uVar3;
  ppVar11->au = (uint)uVar3;
  player_spells_init(ppVar11);
  if ((player->opts).opt[0x28] == true) {
    player_learn_all_runes(player);
  }
  poVar25 = player->obj_k;
  poVar25->ac = 1;
  poVar25->to_a = 1;
  poVar25->to_h = 1;
  poVar25->to_d = 1;
  poVar25->dd = '\x01';
  init_race_probs();
  store_reset();
  chunk_list_max = 0;
  player_learn_innate(player);
  seed_randart = Rand_div(0x10000000);
  initialize_random_artifacts(seed_randart);
  deactivate_randart_file();
  seed_flavor = Rand_div(0x10000000);
  flavor_init();
  if ((player->opts).opt[0x29] == true) {
    flavor_set_all_aware();
  }
  ppVar11 = player;
  player->upkeep->total_weight = L'\0';
  poVar25 = ppVar11->obj_k;
  poVar25->dd = '\x01';
  poVar25->ds = '\x01';
  poVar25->ac = 1;
  wVar30 = L'\x01';
  do {
    poVar21 = lookup_obj_property(L'\x03',wVar30);
    if (poVar21->subtype == L'\x04') {
      flag_on_dbg(ppVar11->obj_k->flags,6,wVar30,"p->obj_k->flags","i");
    }
    if (poVar21->subtype == L'\a') {
      flag_on_dbg(ppVar11->obj_k->flags,6,wVar30,"p->obj_k->flags","i");
    }
    if (poVar21->subtype == L'\b') {
      flag_on_dbg(ppVar11->obj_k->flags,6,wVar30,"p->obj_k->flags","i");
    }
    if (poVar21->subtype == L'\t') {
      flag_on_dbg(ppVar11->obj_k->flags,6,wVar30,"p->obj_k->flags","i");
    }
    wVar30 = wVar30 + L'\x01';
  } while (wVar30 != L'-');
  psVar31 = ppVar11->class->start_items;
  if (psVar31 != (start_item *)0x0) {
    do {
      iVar17 = rand_range(psVar31->min,psVar31->max);
      uVar13 = (uint8_t)iVar17;
      poVar22 = lookup_kind(psVar31->tval,psVar31->sval);
      if (poVar22 == (object_kind *)0x0) {
        __assert_fail("kind",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-birth.c"
                      ,0x2ad,"void player_outfit(struct player *)");
      }
      if (((ppVar11->opts).opt[0x26] == false) && ((ppVar11->opts).opt[0x2b] == false)) {
        _Var14 = tval_is_food_k(poVar22);
        uVar13 = '\x01';
        if ((_Var14) || (_Var14 = tval_is_light_k(poVar22), _Var14)) goto LAB_001b5fe0;
      }
      else {
LAB_001b5fe0:
        puVar23 = (uint *)psVar31->eopts;
        if ((puVar23 != (uint *)0x0) && (uVar28 = *puVar23, uVar28 != 0)) {
          bVar8 = true;
          do {
            puVar23 = puVar23 + 1;
            if ((int)uVar28 < 1) {
              if ((ppVar11->opts).opt[-uVar28] == false) {
                bVar8 = false;
              }
            }
            else if ((ppVar11->opts).opt[uVar28] != false) {
              bVar8 = false;
            }
            uVar28 = *puVar23;
          } while ((uVar28 != 0) && (bVar8));
          if (!bVar8) goto LAB_001b60c7;
        }
        poVar24 = object_new();
        object_prep(poVar24,poVar22,L'\0',MINIMISE);
        poVar24->number = uVar13;
        poVar24->origin = '\x12';
        poVar25 = object_new();
        poVar24->known = poVar25;
        object_set_base_known(ppVar11,poVar24);
        object_flavor_aware(ppVar11,poVar24);
        poVar25 = poVar24->known;
        poVar25->pval = poVar24->pval;
        poVar25->effect = poVar24->effect;
        poVar25->notice = poVar25->notice | 2;
        wVar30 = object_value_real(poVar24,(uint)poVar24->number);
        ppVar11->au = ppVar11->au - wVar30;
        inven_carry(ppVar11,poVar24,true,false);
        poVar22->everseen = true;
      }
LAB_001b60c7:
      psVar31 = psVar31->next;
    } while (psVar31 != (start_item *)0x0);
  }
  if ((ppVar11->opts).opt[0x2b] == true) {
    poVar24 = object_new();
    wVar30 = lookup_sval(L'\x14',"Amethyst");
    poVar22 = lookup_kind(L'\x14',wVar30);
    object_prep(poVar24,poVar22,L'\0',MINIMISE);
    poVar24->modifiers[0x10] = 4;
    flag_on_dbg(poVar24->flags,6,0xd,"obj->flags","OF_TELEPATHY");
    poVar24->origin = '\x12';
    poVar25 = object_new();
    poVar24->known = poVar25;
    object_set_base_known(ppVar11,poVar24);
    object_flavor_aware(ppVar11,poVar24);
    poVar25 = poVar24->known;
    poVar25->pval = poVar24->pval;
    poVar25->effect = poVar24->effect;
    poVar25->notice = poVar25->notice | 2;
    inven_carry(ppVar11,poVar24,true,false);
    poVar22->everseen = true;
    poVar24 = object_new();
    wVar30 = lookup_sval(L'\x18',"Detection");
    poVar22 = lookup_kind(L'\x18',wVar30);
    object_prep(poVar24,poVar22,L'\0',MINIMISE);
    poVar24->origin = '\x12';
    poVar25 = object_new();
    poVar24->known = poVar25;
    object_set_base_known(ppVar11,poVar24);
    object_flavor_aware(ppVar11,poVar24);
    poVar25 = poVar24->known;
    poVar25->pval = poVar24->pval;
    poVar25->effect = poVar24->effect;
    poVar25->notice = poVar25->notice | 2;
    inven_carry(ppVar11,poVar24,true,false);
    poVar22->everseen = true;
    poVar24 = object_new();
    wVar30 = lookup_sval(L'\x18',"Magic Mapping");
    poVar22 = lookup_kind(L'\x18',wVar30);
    object_prep(poVar24,poVar22,L'\0',MINIMISE);
    poVar24->origin = '\x12';
    poVar25 = object_new();
    poVar24->known = poVar25;
    object_set_base_known(ppVar11,poVar24);
    object_flavor_aware(ppVar11,poVar24);
    poVar25 = poVar24->known;
    poVar25->pval = poVar24->pval;
    poVar25->effect = poVar24->effect;
    poVar25->notice = poVar25->notice | 2;
    inven_carry(ppVar11,poVar24,true,false);
    poVar22->everseen = true;
    poVar24 = object_new();
    wVar30 = lookup_sval(L'\x19',"*Destruction*");
    poVar22 = lookup_kind(L'\x19',wVar30);
    object_prep(poVar24,poVar22,L'\0',MINIMISE);
    poVar24->number = '\x05';
    poVar24->origin = '\x12';
    poVar25 = object_new();
    poVar24->known = poVar25;
    object_set_base_known(ppVar11,poVar24);
    object_flavor_aware(ppVar11,poVar24);
    poVar25 = poVar24->known;
    poVar25->pval = poVar24->pval;
    poVar25->effect = poVar24->effect;
    poVar25->notice = poVar25->notice | 2;
    inven_carry(ppVar11,poVar24,true,false);
    poVar22->everseen = true;
    poVar24 = object_new();
    wVar30 = lookup_sval(L'\x19',"Identify Rune");
    poVar22 = lookup_kind(L'\x19',wVar30);
    object_prep(poVar24,poVar22,L'\0',MINIMISE);
    poVar24->number = '\x0f';
    poVar24->origin = '\x12';
    poVar25 = object_new();
    poVar24->known = poVar25;
    object_set_base_known(ppVar11,poVar24);
    object_flavor_aware(ppVar11,poVar24);
    poVar25 = poVar24->known;
    poVar25->pval = poVar24->pval;
    poVar25->effect = poVar24->effect;
    poVar25->notice = poVar25->notice | 2;
    inven_carry(ppVar11,poVar24,true,false);
    poVar22->everseen = true;
  }
  if (ppVar11->au < 0) {
    ppVar11->au = 0;
  }
  wield_all(ppVar11);
  wVar30 = slot_by_name(player,"weapon");
  poVar25 = slot_object(player,wVar30);
  ptVar26 = town_by_name(world,ppVar11->race->hometown);
  if ((((poVar25 != (object *)0x0) && (player->home != 0)) && (ptVar26 != (town *)0x0)) &&
     ((ptVar26->ego != (char *)0x0 &&
      (peVar27 = lookup_ego_item(ptVar26->ego,(uint)poVar25->tval,(uint)poVar25->sval),
      peVar27 != (ego_item *)0x0)))) {
    poVar6 = poVar25->prev;
    poVar7 = poVar25->next;
    poVar24 = poVar25->known;
    object_prep(poVar25,poVar25->kind,(int)ppVar11->depth,MINIMISE);
    poVar25->ego = peVar27;
    poVar25->prev = poVar6;
    poVar25->next = poVar7;
    poVar25->known = poVar24;
    ego_apply_magic(poVar25,(int)ppVar11->depth,MINIMISE);
    player_know_object(ppVar11,poVar25);
    while (_Var14 = object_fully_known(poVar25), !_Var14) {
      object_learn_unknown_rune(ppVar11,poVar25,false);
    }
  }
  update_player_object_knowledge(ppVar11);
  ppVar11 = player;
  puVar1 = &player->upkeep->update;
  *puVar1 = *puVar1 | 5;
  update_stuff(ppVar11);
  ppVar11 = player;
  piVar2 = &player->msp;
  player->chp = player->mhp;
  ppVar11->csp = *piVar2;
  ppVar11->is_dead = false;
  character_generated = true;
  ppVar11->upkeep->playing = true;
  cmd_disable_repeat();
  string_free(prev.history);
  prev.history = (char *)0x0;
  string_free(quickstart_prev.history);
  quickstart_prev.history = (char *)0x0;
  event_signal(EVENT_LEAVE_BIRTH);
  return;
}

Assistant:

void do_cmd_accept_character(struct command *cmd)
{
	options_init_cheat();

	/* Turn off persistent levels, for now */
	option_set(option_name(OPT_birth_levels_persist), 0);

	roll_hp();

	ignore_birth_init();

	/* Handle player placement */
	if (OPT(player, birth_thrall)) {
		player->place = level_by_name(world, "Anfauglith 58")->index;
		player->upkeep->create_stair = FEAT_MORE;
	} else {
		player->place = player->home;
	}

	/* Clear old messages, add new starting message */
	history_clear(player);
	history_add(player, "Began the quest to destroy Morgoth.", HIST_PLAYER_BIRTH);

	/* Note player birth in the message recall */
	message_add(" ", MSG_GENERIC);
	message_add("  ", MSG_GENERIC);
	message_add("====================", MSG_GENERIC);
	message_add("  ", MSG_GENERIC);
	message_add(" ", MSG_GENERIC);

	/* Embody */
	player_embody(player);

	/* Give the player some money */
	get_money(player);

	/* Initialise the spells */
	player_spells_init(player);

	/* Know all runes for ID on walkover */
	if (OPT(player, birth_know_runes))
		player_learn_all_runes(player);

	/* Hack - player knows all combat runes.  Maybe make them not runes? NRM */
	player->obj_k->to_a = 1;
	player->obj_k->to_h = 1;
	player->obj_k->to_d = 1;
	player->obj_k->ac = 1;
	player->obj_k->dd = 1;

	/* Initialise the stores, dungeon */
	init_race_probs();
	store_reset();
	chunk_list_max = 0;

	/* Player learns innate runes */
	player_learn_innate(player);

	/* Generate random artifacts */
	seed_randart = randint0(0x10000000);
	initialize_random_artifacts(seed_randart);
	deactivate_randart_file();

	/* Seed for flavors */
	seed_flavor = randint0(0x10000000);
	flavor_init();

	/* Know all flavors for auto-ID of consumables */
	if (OPT(player, birth_know_flavors))
		flavor_set_all_aware();

	/* Outfit the player, if they can sell the stuff */
	player_outfit(player);

	/* Max HP and SP */
	get_bonuses();

	/* Stop the player being quite so dead */
	player->is_dead = false;

	/* Character is now "complete" */
	character_generated = true;
	player->upkeep->playing = true;

	/* Disable repeat command, so we don't try to be born again */
	cmd_disable_repeat();

	/* No longer need the cached history. */
	string_free(prev.history);
	prev.history = NULL;
	string_free(quickstart_prev.history);
	quickstart_prev.history = NULL;

	/* Now we're really done.. */
	event_signal(EVENT_LEAVE_BIRTH);
}